

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O0

void __thiscall Fluid::draw_particles(Fluid *this,mat4 *projection,mat4 *view,vec4 *viewport)

{
  GLsizei GVar1;
  PFNGLDRAWARRAYSINSTANCEDPROC p_Var2;
  PFNGLUNIFORM3FVPROC p_Var3;
  PFNGLUNIFORM4FVPROC p_Var4;
  PFNGLUNIFORMMATRIX4FVPROC p_Var5;
  GLint GVar6;
  int iVar7;
  float *pfVar8;
  socklen_t __len;
  PFNGLUNIFORM3FVPROC p_Var9;
  sockaddr *__addr;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  vec4 *local_28;
  vec4 *viewport_local;
  mat4 *view_local;
  mat4 *projection_local;
  Fluid *this_local;
  
  local_28 = viewport;
  viewport_local = view->value;
  view_local = projection;
  projection_local = (mat4 *)this;
  gfx::Program::use(&this->program);
  p_Var5 = glad_glUniformMatrix4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"projection",&local_49);
  GVar6 = gfx::Program::uniform_loc(&this->program,&local_48);
  pfVar8 = glm::value_ptr<float,(glm::qualifier)0>(view_local);
  (*p_Var5)(GVar6,1,'\0',pfVar8);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  p_Var5 = glad_glUniformMatrix4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"view",&local_81);
  GVar6 = gfx::Program::uniform_loc(&this->program,&local_80);
  pfVar8 = glm::value_ptr<float,(glm::qualifier)0>
                     ((mat<4,_4,_float,_(glm::qualifier)0> *)viewport_local);
  (*p_Var5)(GVar6,1,'\0',pfVar8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  p_Var4 = glad_glUniform4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"viewport",&local_a9);
  GVar6 = gfx::Program::uniform_loc(&this->program,&local_a8);
  pfVar8 = glm::value_ptr<float,(glm::qualifier)0>(local_28);
  (*p_Var4)(GVar6,1,pfVar8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  p_Var3 = glad_glUniform3fv;
  p_Var9 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  __len = (socklen_t)p_Var9;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"look",&local_d1);
  GVar6 = gfx::Program::uniform_loc(&this->program,&local_d0);
  pfVar8 = glm::value_ptr<float,(glm::qualifier)0>(&this->look);
  iVar7 = 1;
  (*p_Var3)(GVar6,1,pfVar8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  gfx::VAO::bind(&this->vao,iVar7,__addr,__len);
  p_Var2 = glad_glDrawArraysInstanced;
  GVar1 = this->num_circle_vertices;
  iVar7 = gfx::Buffer::length(&this->particle_ssbo);
  (*p_Var2)(6,0,GVar1,iVar7);
  gfx::VAO::unbind(&this->vao);
  gfx::Program::disuse(&this->program);
  return;
}

Assistant:

void draw_particles(const glm::mat4& projection, const glm::mat4& view, const glm::vec4& viewport) {
        program.use();
        glUniformMatrix4fv(program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
        glUniformMatrix4fv(program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
        glUniform4fv(program.uniform_loc("viewport"), 1, glm::value_ptr(viewport));
        glUniform3fv(program.uniform_loc("look"), 1, glm::value_ptr(look));
        vao.bind();
        glDrawArraysInstanced(GL_TRIANGLE_FAN, 0, num_circle_vertices, particle_ssbo.length());
        vao.unbind();
        program.disuse();
    }